

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

void slang::ast::addBuiltInMethods(Scope *scope,bool isCovergroup)

{
  Compilation *compilation;
  Type *returnType;
  Type *returnType_00;
  undefined7 in_register_00000031;
  Type *pTVar1;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  MethodBuilder get_inst_coverage;
  MethodBuilder get_coverage;
  MethodBuilder builder_3;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_200;
  uint local_1f8;
  undefined2 local_1f4;
  _Storage<slang::SVInt,_false> local_1f0;
  char local_1e0;
  _Storage<slang::SVInt,_false> local_1d8;
  char local_1c8;
  _Storage<slang::SVInt,_false> local_1c0;
  char local_1b0;
  _Storage<slang::SVInt,_false> local_1a8;
  char local_198;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_190;
  uint local_188;
  undefined1 uStack_184;
  byte bStack_183;
  undefined2 uStack_182;
  _Storage<slang::SVInt,_false> local_140;
  char local_130;
  Type *local_128;
  MethodBuilder local_120;
  MethodBuilder local_d0;
  MethodBuilder local_80;
  
  compilation = scope->compilation;
  returnType = compilation->voidType;
  returnType_00 = compilation->realType;
  pTVar1 = compilation->intType;
  if ((int)CONCAT71(in_register_00000031,isCovergroup) != 0) {
    pTVar1 = compilation->stringType;
    name_04._M_str = "set_inst_name";
    name_04._M_len = 0xd;
    local_128 = compilation->intType;
    MethodBuilder::MethodBuilder(&local_120,compilation,name_04,returnType,Function);
    Scope::addMember(scope,&(local_120.symbol)->super_Symbol);
    local_130 = '\0';
    name._M_str = "name";
    name._M_len = 4;
    MethodBuilder::addArg(&local_120,name,pTVar1,In,(optional<slang::SVInt> *)&local_140._M_value);
    if ((local_130 == '\x01') &&
       (((local_130 = '\0', 0x40 < local_140._M_value.super_SVIntStorage.bitWidth ||
         ((local_140._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
        (local_140._M_value.super_SVIntStorage.field_0.val != 0)))) {
      operator_delete__((void *)local_140._M_value.super_SVIntStorage.field_0);
    }
    MethodBuilder::~MethodBuilder(&local_120);
    pTVar1 = local_128;
  }
  name_05._M_str = "get_coverage";
  name_05._M_len = 0xc;
  MethodBuilder::MethodBuilder(&local_120,compilation,name_05,returnType_00,Function);
  Scope::addMember(scope,&(local_120.symbol)->super_Symbol);
  MethodBuilder::addFlags(&local_120,(bitmask<slang::ast::MethodFlags>)0x4);
  local_188 = 0x20;
  uStack_184 = 1;
  bStack_183 = 0;
  local_190.val = 0;
  SVInt::clearUnusedBits((SVInt *)&local_190);
  local_1a8._M_value.super_SVIntStorage.field_0 = local_190;
  local_1a8._M_value.super_SVIntStorage.bitWidth = local_188;
  local_1a8._M_value.super_SVIntStorage.signFlag = (bool)uStack_184;
  local_1a8._M_value.super_SVIntStorage.unknownFlag = (bool)bStack_183;
  if (0x40 < local_188 || (bStack_183 & 1) != 0) {
    local_190.val = 0;
  }
  local_198 = '\x01';
  name_00._M_str = "covered_bins";
  name_00._M_len = 0xc;
  MethodBuilder::addArg(&local_120,name_00,pTVar1,Ref,(optional<slang::SVInt> *)&local_1a8._M_value)
  ;
  if (((local_198 == '\x01') &&
      ((local_198 = '\0', 0x40 < local_1a8._M_value.super_SVIntStorage.bitWidth ||
       ((local_1a8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_1a8._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_1a8._M_value.super_SVIntStorage.field_0);
  }
  if (((0x40 < local_188) || ((bStack_183 & 1) != 0)) && ((void *)local_190.val != (void *)0x0)) {
    operator_delete__(local_190.pVal);
  }
  local_188 = 0x20;
  uStack_184 = 1;
  bStack_183 = 0;
  local_190.val = 0;
  SVInt::clearUnusedBits((SVInt *)&local_190);
  local_1c0._M_value.super_SVIntStorage.field_0 = local_190;
  local_1c0._M_value.super_SVIntStorage.bitWidth = local_188;
  local_1c0._M_value.super_SVIntStorage.signFlag = (bool)uStack_184;
  local_1c0._M_value.super_SVIntStorage.unknownFlag = (bool)bStack_183;
  if (0x40 < local_188 || (bStack_183 & 1) != 0) {
    local_190.val = 0;
  }
  local_1b0 = '\x01';
  name_01._M_str = "total_bins";
  name_01._M_len = 10;
  MethodBuilder::addArg(&local_120,name_01,pTVar1,Ref,(optional<slang::SVInt> *)&local_1c0._M_value)
  ;
  if ((local_1b0 == '\x01') &&
     (((local_1b0 = '\0', 0x40 < local_1c0._M_value.super_SVIntStorage.bitWidth ||
       ((local_1c0._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_1c0._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_1c0._M_value.super_SVIntStorage.field_0);
  }
  if (((0x40 < local_188) || ((bStack_183 & 1) != 0)) && ((void *)local_190.val != (void *)0x0)) {
    operator_delete__(local_190.pVal);
  }
  name_06._M_str = "get_inst_coverage";
  name_06._M_len = 0x11;
  MethodBuilder::MethodBuilder
            ((MethodBuilder *)&local_190,compilation,name_06,returnType_00,Function);
  Scope::addMember(scope,(Symbol *)
                         CONCAT26(uStack_182,CONCAT15(bStack_183,CONCAT14(uStack_184,local_188))));
  local_1f8 = 0x20;
  local_1f4 = 1;
  local_200.val = 0;
  SVInt::clearUnusedBits((SVInt *)&local_200);
  local_1d8._M_value.super_SVIntStorage.field_0 = local_200;
  local_1d8._M_value.super_SVIntStorage.bitWidth = local_1f8;
  local_1d8._M_value.super_SVIntStorage.signFlag = (bool)(undefined1)local_1f4;
  local_1d8._M_value.super_SVIntStorage.unknownFlag = (bool)local_1f4._1_1_;
  if (0x40 < local_1f8 || (local_1f4 & 0x100) != 0) {
    local_200.val = 0;
  }
  local_1c8 = '\x01';
  name_02._M_str = "covered_bins";
  name_02._M_len = 0xc;
  MethodBuilder::addArg
            ((MethodBuilder *)&local_190,name_02,pTVar1,Ref,
             (optional<slang::SVInt> *)&local_1d8._M_value);
  if (((local_1c8 == '\x01') &&
      ((local_1c8 = '\0', 0x40 < local_1d8._M_value.super_SVIntStorage.bitWidth ||
       ((local_1d8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_1d8._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_1d8._M_value.super_SVIntStorage.field_0);
  }
  if (((0x40 < local_1f8) || ((local_1f4 & 0x100) != 0)) && ((void *)local_200.val != (void *)0x0))
  {
    operator_delete__(local_200.pVal);
  }
  local_1f8 = 0x20;
  local_1f4 = 1;
  local_200.val = 0;
  SVInt::clearUnusedBits((SVInt *)&local_200);
  local_1f0._M_value.super_SVIntStorage.field_0 = local_200;
  local_1f0._M_value.super_SVIntStorage.bitWidth = local_1f8;
  local_1f0._M_value.super_SVIntStorage.signFlag = (bool)(undefined1)local_1f4;
  local_1f0._M_value.super_SVIntStorage.unknownFlag = (bool)local_1f4._1_1_;
  if (0x40 < local_1f8 || (local_1f4 & 0x100) != 0) {
    local_200.val = 0;
  }
  local_1e0 = '\x01';
  name_03._M_str = "total_bins";
  name_03._M_len = 10;
  MethodBuilder::addArg
            ((MethodBuilder *)&local_190,name_03,pTVar1,Ref,
             (optional<slang::SVInt> *)&local_1f0._M_value);
  if (((local_1e0 == '\x01') &&
      ((local_1e0 = '\0', 0x40 < local_1f0._M_value.super_SVIntStorage.bitWidth ||
       ((local_1f0._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_1f0._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_1f0._M_value.super_SVIntStorage.field_0);
  }
  if (((0x40 < local_1f8) || ((local_1f4 & 0x100) != 0)) && ((void *)local_200.val != (void *)0x0))
  {
    operator_delete__(local_200.pVal);
  }
  name_07._M_str = "start";
  name_07._M_len = 5;
  MethodBuilder::MethodBuilder(&local_80,compilation,name_07,returnType,Function);
  Scope::addMember(scope,&(local_80.symbol)->super_Symbol);
  MethodBuilder::~MethodBuilder(&local_80);
  name_08._M_str = "stop";
  name_08._M_len = 4;
  MethodBuilder::MethodBuilder(&local_d0,compilation,name_08,returnType,Function);
  Scope::addMember(scope,&(local_d0.symbol)->super_Symbol);
  MethodBuilder::~MethodBuilder(&local_d0);
  MethodBuilder::~MethodBuilder((MethodBuilder *)&local_190);
  MethodBuilder::~MethodBuilder(&local_120);
  return;
}

Assistant:

static void addBuiltInMethods(Scope& scope, bool isCovergroup) {
    auto& comp = scope.getCompilation();
    auto makeFunc = [&](string_view funcName, const Type& returnType) {
        MethodBuilder builder(comp, funcName, returnType, SubroutineKind::Function);
        scope.addMember(builder.symbol);
        return builder;
    };

    auto& void_t = comp.getVoidType();
    auto& int_t = comp.getIntType();
    auto& real_t = comp.getRealType();
    auto& string_t = comp.getStringType();

    if (isCovergroup)
        makeFunc("set_inst_name"sv, void_t).addArg("name"sv, string_t);

    auto get_coverage = makeFunc("get_coverage"sv, real_t);
    get_coverage.addFlags(MethodFlags::Static);
    get_coverage.addArg("covered_bins"sv, int_t, ArgumentDirection::Ref, SVInt(32, 0, true));
    get_coverage.addArg("total_bins"sv, int_t, ArgumentDirection::Ref, SVInt(32, 0, true));

    auto get_inst_coverage = makeFunc("get_inst_coverage"sv, real_t);
    get_inst_coverage.addArg("covered_bins"sv, int_t, ArgumentDirection::Ref, SVInt(32, 0, true));
    get_inst_coverage.addArg("total_bins"sv, int_t, ArgumentDirection::Ref, SVInt(32, 0, true));

    makeFunc("start"sv, void_t);
    makeFunc("stop"sv, void_t);
}